

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

string * __thiscall
GraphPropagator::available_to_dot_abi_cxx11_(string *__return_storage_ptr__,GraphPropagator *this)

{
  BoolView *pBVar1;
  GraphPropagator *pGVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong *puVar9;
  long *plVar10;
  uint uVar11;
  string *psVar12;
  uint uVar13;
  ulong uVar14;
  string __str;
  string __str_2;
  string __str_1;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string *local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  GraphPropagator *local_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  local_b0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"graph {\n","");
  local_80 = this;
  if (0 < (int)(this->vs).sz) {
    uVar14 = 0;
    do {
      pBVar1 = (this->vs).data;
      if ((sat.assigns.data[(uint)pBVar1[uVar14].v] != '\0') &&
         ((uint)pBVar1[uVar14].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar1[uVar14].v])) {
        uVar11 = 1;
        if (9 < uVar14) {
          uVar3 = 4;
          uVar8 = uVar14;
          do {
            uVar11 = uVar3;
            uVar13 = (uint)uVar8;
            if (uVar13 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_001cc05c;
            }
            if (uVar13 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_001cc05c;
            }
            if (uVar13 < 10000) goto LAB_001cc05c;
            uVar8 = (uVar8 & 0xffffffff) / 10000;
            uVar3 = uVar11 + 4;
          } while (99999 < uVar13);
          uVar11 = uVar11 + 1;
        }
LAB_001cc05c:
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,uVar11,(uint)uVar14);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dbae4);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_e0 = *puVar9;
          lStack_d8 = plVar6[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar9;
          local_f0 = (ulong *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_c0 = *plVar10;
          lStack_b8 = plVar6[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar10;
          local_d0 = (long *)*plVar6;
        }
        local_c8 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        this = local_80;
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)(int)(this->vs).sz);
  }
  psVar12 = local_b0;
  if (0 < (int)(this->es).sz) {
    uVar14 = 0;
    do {
      pBVar1 = (this->es).data;
      if ((sat.assigns.data[(uint)pBVar1[uVar14].v] == '\0') ||
         ((uint)pBVar1[uVar14].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar1[uVar14].v])) {
        local_58 = uVar14 * 3;
        uVar11 = **(uint **)&(this->endnodes).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar14].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
        uVar3 = -uVar11;
        if (0 < (int)uVar11) {
          uVar3 = uVar11;
        }
        uVar13 = 1;
        if (9 < uVar3) {
          uVar8 = (ulong)uVar3;
          uVar4 = 4;
          do {
            uVar13 = uVar4;
            uVar5 = (uint)uVar8;
            if (uVar5 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001cc257;
            }
            if (uVar5 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001cc257;
            }
            if (uVar5 < 10000) goto LAB_001cc257;
            uVar8 = uVar8 / 10000;
            uVar4 = uVar13 + 4;
          } while (99999 < uVar5);
          uVar13 = uVar13 + 1;
        }
LAB_001cc257:
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct
                  ((ulong)local_50,(char)uVar13 - (char)((int)uVar11 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar11 >> 0x1f),uVar13,uVar3)
        ;
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1dbae4);
        local_a8 = &local_98;
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_98 = *plVar10;
          lStack_90 = plVar6[3];
        }
        else {
          local_98 = *plVar10;
          local_a8 = (long *)*plVar6;
        }
        local_a0 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_e0 = *puVar9;
          lStack_d8 = plVar6[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar9;
          local_f0 = (ulong *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar11 = *(uint *)(*(long *)((long)&(((local_80->endnodes).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data + local_58 * 8) + 4);
        uVar3 = -uVar11;
        if (0 < (int)uVar11) {
          uVar3 = uVar11;
        }
        uVar13 = 1;
        if (9 < uVar3) {
          uVar8 = (ulong)uVar3;
          uVar4 = 4;
          do {
            uVar13 = uVar4;
            uVar5 = (uint)uVar8;
            if (uVar5 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001cc3c7;
            }
            if (uVar5 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001cc3c7;
            }
            if (uVar5 < 10000) goto LAB_001cc3c7;
            uVar8 = uVar8 / 10000;
            uVar4 = uVar13 + 4;
          } while (99999 < uVar5);
          uVar13 = uVar13 + 1;
        }
LAB_001cc3c7:
        local_78 = local_68;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_78,(char)uVar13 - (char)((int)uVar11 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_78),uVar13,uVar3);
        psVar12 = local_b0;
        uVar8 = 0xf;
        if (local_f0 != &local_e0) {
          uVar8 = local_e0;
        }
        if (uVar8 < (ulong)(local_70 + local_e8)) {
          uVar8 = 0xf;
          if (local_78 != local_68) {
            uVar8 = local_68[0];
          }
          if (uVar8 < (ulong)(local_70 + local_e8)) goto LAB_001cc469;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_001cc469:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_78);
        }
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = puVar7[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*puVar7;
        }
        local_c8 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
        pGVar2 = local_80;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pBVar1 = (pGVar2->es).data;
        if ((sat.assigns.data[(uint)pBVar1[uVar14].v] != '\0') &&
           ((uint)pBVar1[uVar14].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar1[uVar14].v])) {
          std::__cxx11::string::append((char *)psVar12);
        }
        uVar11 = 1;
        if (9 < uVar14) {
          uVar3 = 4;
          uVar8 = uVar14;
          do {
            uVar11 = uVar3;
            uVar13 = (uint)uVar8;
            if (uVar13 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_001cc5df;
            }
            if (uVar13 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_001cc5df;
            }
            if (uVar13 < 10000) goto LAB_001cc5df;
            uVar8 = (uVar8 & 0xffffffff) / 10000;
            uVar3 = uVar11 + 4;
          } while (99999 < uVar13);
          uVar11 = uVar11 + 1;
        }
LAB_001cc5df:
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct((ulong)&local_a8,(char)uVar11);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,uVar11,(uint)uVar14);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x1dff8f);
        puVar9 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar9) {
          local_e0 = *puVar9;
          lStack_d8 = puVar7[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar9;
          local_f0 = (ulong *)*puVar7;
        }
        local_e8 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_c0 = *plVar6;
          lStack_b8 = puVar7[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar6;
          local_d0 = (long *)*puVar7;
        }
        local_c8 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar12,(ulong)local_d0);
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0);
        }
        this = local_80;
        if (local_a8 != &local_98) {
          operator_delete(local_a8);
        }
        std::__cxx11::string::append((char *)psVar12);
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)(int)(this->es).sz);
  }
  std::__cxx11::string::append((char *)psVar12);
  return psVar12;
}

Assistant:

std::string GraphPropagator::available_to_dot() {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isTrue()) {
			res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
			if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
				res += " [color = red] ";
			}
			res += "[label = \"" + std::to_string(e) + "\"]";
			res += ";\n";
		}
	}
	res += "}";

	return res;
}